

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_generator.cpp
# Opt level: O0

void __thiscall
front::irGenerator::irGenerator::ir_assign(irGenerator *this,LeftVal *dest,uint32_t sourceId)

{
  LabelId LVar1;
  LeftVal *leftVal;
  key_type *__k;
  shared_ptr<mir::inst::AssignInst> assginInst;
  shared_ptr<mir::inst::Value> srcValue;
  shared_ptr<mir::inst::VarId> destVarId;
  undefined4 in_stack_fffffffffffffe88;
  uint32_t in_stack_fffffffffffffe8c;
  Value *in_stack_fffffffffffffe90;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *this_00;
  Value *_src;
  undefined4 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffef0;
  Value local_58 [2];
  
  std::shared_ptr<mir::inst::VarId>::shared_ptr((shared_ptr<mir::inst::VarId> *)0x26066d);
  std::shared_ptr<mir::inst::Value>::shared_ptr((shared_ptr<mir::inst::Value> *)0x26067a);
  std::shared_ptr<mir::inst::AssignInst>::shared_ptr((shared_ptr<mir::inst::AssignInst> *)0x260687);
  leftVal = (LeftVal *)operator_new(0x10);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)in_stack_fffffffffffffe90,
          (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  LVar1 = LeftValueToLabelId((irGenerator *)in_stack_fffffffffffffef0,leftVal);
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  std::shared_ptr<mir::inst::VarId>::shared_ptr<mir::inst::VarId,void>
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe90,
             (VarId *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  _src = local_58;
  std::shared_ptr<mir::inst::VarId>::operator=
            ((shared_ptr<mir::inst::VarId> *)in_stack_fffffffffffffe90,
             (shared_ptr<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x26071c);
  std::
  variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~variant((variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x260729);
  __k = (key_type *)operator_new(0x20);
  mir::inst::VarId::VarId((VarId *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
  mir::inst::Value::Value
            (in_stack_fffffffffffffe90,
             (VarId *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<mir::inst::Value>::shared_ptr<mir::inst::Value,void>
            ((shared_ptr<mir::inst::Value> *)in_stack_fffffffffffffe90,
             (Value *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<mir::inst::Value>::operator=
            ((shared_ptr<mir::inst::Value> *)in_stack_fffffffffffffe90,
             (shared_ptr<mir::inst::Value> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x26079c);
  operator_new(0x38);
  std::__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::VarId,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe90);
  mir::inst::VarId::VarId
            ((VarId *)in_stack_fffffffffffffe90,
             (VarId *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<mir::inst::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffe90);
  mir::inst::Value::Value
            (in_stack_fffffffffffffe90,
             (Value *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  mir::inst::AssignInst::AssignInst
            ((AssignInst *)CONCAT44(LVar1,in_stack_fffffffffffffed0),(VarId *)__k,_src);
  std::shared_ptr<mir::inst::AssignInst>::shared_ptr<mir::inst::AssignInst,void>
            ((shared_ptr<mir::inst::AssignInst> *)in_stack_fffffffffffffe90,
             (AssignInst *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<mir::inst::AssignInst>::operator=
            ((shared_ptr<mir::inst::AssignInst> *)in_stack_fffffffffffffe90,
             (shared_ptr<mir::inst::AssignInst> *)
             CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::shared_ptr<mir::inst::AssignInst>::~shared_ptr((shared_ptr<mir::inst::AssignInst> *)0x26083d)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe90);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>_>_>_>
                *)CONCAT44(LVar1,in_stack_fffffffffffffed0),__k);
  this_00 = (variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
             *)&stack0xfffffffffffffef0;
  std::
  variant<std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
  ::variant<std::shared_ptr<mir::inst::AssignInst>&,void,void,std::shared_ptr<mir::inst::Inst>,void>
            (this_00,(shared_ptr<mir::inst::AssignInst> *)
                     CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  std::
  vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
  ::push_back((vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               *)this_00,(value_type *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
             );
  std::
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  ::~variant((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              *)0x2608a0);
  std::shared_ptr<mir::inst::AssignInst>::~shared_ptr((shared_ptr<mir::inst::AssignInst> *)0x2608ad)
  ;
  std::shared_ptr<mir::inst::Value>::~shared_ptr((shared_ptr<mir::inst::Value> *)0x2608ba);
  std::shared_ptr<mir::inst::VarId>::~shared_ptr((shared_ptr<mir::inst::VarId> *)0x2608c7);
  return;
}

Assistant:

void irGenerator::ir_assign(LeftVal dest, uint32_t sourceId) {
  shared_ptr<VarId> destVarId;
  shared_ptr<Value> srcValue;
  shared_ptr<mir::inst::AssignInst> assginInst;

  destVarId = shared_ptr<VarId>(new VarId(LeftValueToLabelId(dest)));
  srcValue = shared_ptr<Value>(new Value(VarId(sourceId)));

  assginInst = shared_ptr<mir::inst::AssignInst>(
      new mir::inst::AssignInst(*destVarId, *srcValue));

  _funcNameToInstructions[_funcStack.back()].push_back(assginInst);
}